

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosTagger.hpp
# Opt level: O0

PosTagger * __thiscall
cppjieba::PosTagger::LookupTag(PosTagger *this,string *str,SegmentTagged *segment)

{
  DictTrie *this_00;
  bool bVar1;
  ostream *poVar2;
  const_iterator begin;
  const_iterator end;
  ulong uVar3;
  char *pcVar4;
  long *in_RCX;
  allocator local_329;
  undefined4 local_328;
  allocator local_321;
  Logger local_320;
  DictTrie *local_190;
  DictTrie *dict;
  RuneStrArray runes;
  DictUnit *tmp;
  SegmentTagged *segment_local;
  string *str_local;
  PosTagger *this_local;
  
  runes.capacity_ = 0;
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector((LocalVector<cppjieba::RuneStr> *)&dict);
  local_190 = (DictTrie *)(**(code **)(*in_RCX + 0x20))();
  if (local_190 == (DictTrie *)0x0) {
    __assert_fail("dict != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/PosTagger.hpp"
                  ,0x24,
                  "string cppjieba::PosTagger::LookupTag(const string &, const SegmentTagged &) const"
                 );
  }
  bVar1 = DecodeRunesInString((string *)segment,(RuneStrArray *)&dict);
  this_00 = local_190;
  if (bVar1) {
    begin = limonp::LocalVector<cppjieba::RuneStr>::begin((LocalVector<cppjieba::RuneStr> *)&dict);
    end = limonp::LocalVector<cppjieba::RuneStr>::end((LocalVector<cppjieba::RuneStr> *)&dict);
    runes.capacity_ = (size_t)DictTrie::Find(this_00,begin,end);
    if ((DictUnit *)runes.capacity_ != (DictUnit *)0x0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::string((string *)this,(string *)(runes.capacity_ + 0x60));
        goto LAB_0011a88f;
      }
    }
    pcVar4 = SpecialRule((PosTagger *)str,(RuneStrArray *)&dict);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar4,&local_329);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
  }
  else {
    limonp::Logger::Logger
              (&local_320,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/PosTagger.hpp"
               ,0x26);
    poVar2 = limonp::Logger::Stream(&local_320);
    std::operator<<(poVar2,"Decode failed.");
    limonp::Logger::~Logger(&local_320);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"x",&local_321);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
  }
LAB_0011a88f:
  local_328 = 1;
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector((LocalVector<cppjieba::RuneStr> *)&dict);
  return this;
}

Assistant:

string LookupTag(const string &str, const SegmentTagged& segment) const {
    const DictUnit *tmp = NULL;
    RuneStrArray runes;
    const DictTrie * dict = segment.GetDictTrie();
    assert(dict != NULL);
      if (!DecodeRunesInString(str, runes)) {
        XLOG(ERROR) << "Decode failed.";
        return POS_X;
      }
      tmp = dict->Find(runes.begin(), runes.end());
      if (tmp == NULL || tmp->tag.empty()) {
        return SpecialRule(runes);
      } else {
        return tmp->tag;
      }
  }